

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjAdd(jx9_value *pObj1,jx9_value *pObj2,int bAddStore)

{
  sxi32 sVar1;
  jx9_hashmap *pjStack_50;
  sxi32 rc;
  jx9_hashmap *pMap;
  sxi64 b_1;
  sxi64 a_1;
  jx9_real b;
  jx9_real a;
  int bAddStore_local;
  jx9_value *pObj2_local;
  jx9_value *pObj1_local;
  
  if (((pObj1->iFlags | pObj2->iFlags) & 0x40U) == 0) {
    jx9MemObjToNumeric(pObj1);
    jx9MemObjToNumeric(pObj2);
    if (((pObj1->iFlags | pObj2->iFlags) & 4U) == 0) {
      (pObj1->x).pOther = (void *)((long)(pObj1->x).pOther + (long)(pObj2->x).pOther);
      pObj1->iFlags = pObj1->iFlags & 0xfffffe90U | 2;
    }
    else {
      if ((pObj1->iFlags & 4U) == 0) {
        jx9MemObjToReal(pObj1);
      }
      if ((pObj2->iFlags & 4U) == 0) {
        jx9MemObjToReal(pObj2);
      }
      (pObj1->x).rVal = (pObj1->x).rVal + (pObj2->x).rVal;
      pObj1->iFlags = pObj1->iFlags & 0xfffffe90U | 4;
      MemObjTryIntger(pObj1);
    }
  }
  else if (((pObj1->iFlags | pObj2->iFlags) & 0x40U) != 0) {
    if (bAddStore == 0) {
      pjStack_50 = jx9NewHashmap(pObj1->pVm,(_func_sxu32_sxi64 *)0x0,
                                 (_func_sxu32_void_ptr_sxu32 *)0x0);
      if (pjStack_50 == (jx9_hashmap *)0x0) {
        jx9VmThrowError(pObj1->pVm,(SyString *)0x0,1,
                        "JX9 is running out of memory while creating array");
        return -1;
      }
    }
    else {
      if (((pObj1->iFlags & 0x40U) == 0) && (sVar1 = jx9MemObjToHashmap(pObj1), sVar1 != 0)) {
        jx9VmThrowError(pObj1->pVm,(SyString *)0x0,1,
                        "JX9 is running out of memory while creating array");
        return sVar1;
      }
      pjStack_50 = (jx9_hashmap *)(pObj1->x).pOther;
    }
    if (bAddStore == 0) {
      if ((pObj1->iFlags & 0x40U) == 0) {
        if ((pObj1->iFlags & 0x20U) == 0) {
          jx9HashmapInsert(pjStack_50,(jx9_value *)0x0,pObj1);
        }
      }
      else {
        jx9HashmapDup((jx9_hashmap *)(pObj1->x).pOther,pjStack_50);
      }
    }
    if ((pObj2->iFlags & 0x40U) == 0) {
      if ((pObj2->iFlags & 0x20U) == 0) {
        jx9HashmapInsert(pjStack_50,(jx9_value *)0x0,pObj2);
      }
    }
    else {
      jx9HashmapUnion(pjStack_50,(jx9_hashmap *)(pObj2->x).pOther);
    }
    if ((pObj1->iFlags & 1U) != 0) {
      SyBlobRelease(&pObj1->sBlob);
    }
    (pObj1->x).pOther = pjStack_50;
    pObj1->iFlags = pObj1->iFlags & 0xfffffe90U | 0x40;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjAdd(jx9_value *pObj1, jx9_value *pObj2, int bAddStore)
{
	if( ((pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP) == 0 ){
			/* Arithemtic operation */
			jx9MemObjToNumeric(pObj1);
			jx9MemObjToNumeric(pObj2);
			if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_REAL ){
				/* Floating point arithmetic */
				jx9_real a, b;
				if( (pObj1->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj1);
				}
				if( (pObj2->iFlags & MEMOBJ_REAL) == 0 ){
					jx9MemObjToReal(pObj2);
				}
				a = pObj1->x.rVal;
				b = pObj2->x.rVal;
				pObj1->x.rVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_REAL);
				/* Try to get an integer representation also */
				MemObjTryIntger(&(*pObj1));
			}else{
				/* Integer arithmetic */
				sxi64 a, b;
				a = pObj1->x.iVal;
				b = pObj2->x.iVal;
				pObj1->x.iVal = a+b;
				MemObjSetType(pObj1, MEMOBJ_INT);
			}
	}else{
		if( (pObj1->iFlags|pObj2->iFlags) & MEMOBJ_HASHMAP ){
			jx9_hashmap *pMap;
			sxi32 rc;
			if( bAddStore ){
				/* Do not duplicate the hashmap, use the left one since its an add&store operation.
				 */
				if( (pObj1->iFlags & MEMOBJ_HASHMAP) == 0 ){				
					/* Force a hashmap cast */
					rc = jx9MemObjToHashmap(pObj1);
					if( rc != SXRET_OK ){
						jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
						return rc;
					}
				}
				/* Point to the structure that describe the hashmap */
				pMap = (jx9_hashmap *)pObj1->x.pOther;
			}else{
				/* Create a new hashmap */
				pMap = jx9NewHashmap(pObj1->pVm, 0, 0);
				if( pMap == 0){
					jx9VmThrowError(pObj1->pVm, 0, JX9_CTX_ERR, "JX9 is running out of memory while creating array");
					return SXERR_MEM;
				}
			}
			if( !bAddStore ){
				if(pObj1->iFlags & MEMOBJ_HASHMAP ){
					/* Perform a hashmap duplication */
					jx9HashmapDup((jx9_hashmap *)pObj1->x.pOther, pMap);
				}else{
					if((pObj1->iFlags & MEMOBJ_NULL) == 0 ){
						/* Simple insertion */
						jx9HashmapInsert(pMap, 0, pObj1);
					}
				}
			}
			/* Perform the union */
			if(pObj2->iFlags & MEMOBJ_HASHMAP ){
				jx9HashmapUnion(pMap, (jx9_hashmap *)pObj2->x.pOther);
			}else{
				if((pObj2->iFlags & MEMOBJ_NULL) == 0 ){
					/* Simple insertion */
					jx9HashmapInsert(pMap, 0, pObj2);
				}
			}
			/* Reflect the change */
			if( pObj1->iFlags & MEMOBJ_STRING ){
				SyBlobRelease(&pObj1->sBlob);
			}
			pObj1->x.pOther = pMap;
			MemObjSetType(pObj1, MEMOBJ_HASHMAP);
		}
	}
	return SXRET_OK;
}